

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRead.cpp
# Opt level: O2

bool __thiscall
stk::FileRead::getRawInfo
          (FileRead *this,char *fileName,uint nChannels,StkFormat format,StkFloat rate)

{
  int iVar1;
  ostream *poVar2;
  undefined1 *puVar3;
  char *pcVar4;
  long lStack_c0;
  stat filestat;
  
  iVar1 = stat(fileName,(stat *)&filestat);
  if (iVar1 == -1) {
    puVar3 = Stk::oStream__abi_cxx11_;
    pcVar4 = "FileRead: Could not stat RAW file (";
  }
  else {
    if (nChannels != 0) {
      this->dataOffset_ = 0;
      this->channels_ = nChannels;
      this->dataType_ = format;
      this->fileRate_ = rate;
      if (format == 1) {
        lStack_c0 = 1;
      }
      else if (format == 2) {
        lStack_c0 = 2;
      }
      else {
        lStack_c0 = 4;
        if ((format != 8) && (format != 0x10)) {
          if (format != 0x20) {
            poVar2 = std::operator<<((ostream *)Stk::oStream__abi_cxx11_,"FileRead: StkFormat ");
            puVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
            pcVar4 = " is invalid (";
            goto LAB_0010bb51;
          }
          lStack_c0 = 8;
        }
      }
      this->fileSize_ = (filestat.st_size / lStack_c0) / (long)(ulong)nChannels;
      this->byteswap_ = true;
      return true;
    }
    puVar3 = Stk::oStream__abi_cxx11_;
    pcVar4 = "FileRead: number of channels can\'t be 0 (";
  }
LAB_0010bb51:
  poVar2 = std::operator<<((ostream *)puVar3,pcVar4);
  poVar2 = std::operator<<(poVar2,fileName);
  std::operator<<(poVar2,").");
  return false;
}

Assistant:

bool FileRead :: getRawInfo( const char *fileName, unsigned int nChannels, StkFormat format, StkFloat rate )
{
  // Use the system call "stat" to determine the file length.
  struct stat filestat;
  if ( stat(fileName, &filestat) == -1 ) {
    oStream_ << "FileRead: Could not stat RAW file (" << fileName << ").";
    return false;
  }
  if ( nChannels == 0 ) {
    oStream_ << "FileRead: number of channels can't be 0 (" << fileName << ").";
    return false;
  }

  // Rawwave files have no header and by default, are assumed to
  // contain a monophonic stream of 16-bit signed integers in
  // big-endian byte order at a sample rate of 22050 Hz.  However,
  // different parameters can be specified if desired.
  dataOffset_ = 0;
  channels_ = nChannels;
  dataType_ = format;
  fileRate_ = rate;
  int sampleBytes = 0;
  if ( format == STK_SINT8 ) sampleBytes = 1;
  else if ( format == STK_SINT16 ) sampleBytes = 2;
  else if ( format == STK_SINT32 || format == STK_FLOAT32 ) sampleBytes = 4;
  else if ( format == STK_FLOAT64 ) sampleBytes = 8;
  else {
    oStream_ << "FileRead: StkFormat " << format << " is invalid (" << fileName << ").";
    return false;
  }

  fileSize_ = (long) filestat.st_size / sampleBytes / channels_;  // length in frames

  byteswap_ = false;
#ifdef __LITTLE_ENDIAN__
  byteswap_ = true;
#endif

  return true;
}